

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O0

opj_bool jp2_read_pclr(opj_jp2_t *jp2,opj_cio_t *cio,opj_jp2_box_t *box,opj_jp2_color_t *color)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  void *pvVar4;
  void *pvVar5;
  undefined8 *puVar6;
  long in_RCX;
  uchar uc;
  unsigned_short j;
  unsigned_short i;
  unsigned_short nr_channels;
  unsigned_short nr_entries;
  uint *entries;
  uchar *channel_sign;
  uchar *channel_size;
  opj_jp2_pclr_t *jp2_pclr;
  int in_stack_ffffffffffffffac;
  undefined2 in_stack_ffffffffffffffb0;
  undefined2 in_stack_ffffffffffffffb2;
  ushort uVar7;
  ushort uVar8;
  undefined2 in_stack_ffffffffffffffb4;
  undefined2 in_stack_ffffffffffffffb6;
  uint *local_48;
  opj_bool local_4;
  
  if (*(long *)(in_RCX + 0x18) == 0) {
    uVar3 = cio_read((opj_cio_t *)
                     CONCAT26(in_stack_ffffffffffffffb6,
                              CONCAT24(in_stack_ffffffffffffffb4,
                                       CONCAT22(in_stack_ffffffffffffffb2,in_stack_ffffffffffffffb0)
                                      )),in_stack_ffffffffffffffac);
    uVar1 = (ushort)uVar3;
    uVar3 = cio_read((opj_cio_t *)
                     CONCAT26(uVar1,CONCAT24(in_stack_ffffffffffffffb4,
                                             CONCAT22(in_stack_ffffffffffffffb2,
                                                      in_stack_ffffffffffffffb0))),
                     in_stack_ffffffffffffffac);
    uVar2 = (ushort)uVar3;
    local_48 = (uint *)malloc((long)(int)((uVar3 & 0xffff) * (uint)uVar1) << 2);
    pvVar4 = malloc((ulong)uVar2);
    pvVar5 = malloc((ulong)uVar2);
    puVar6 = (undefined8 *)malloc(0x28);
    puVar6[1] = pvVar5;
    puVar6[2] = pvVar4;
    *puVar6 = local_48;
    *(ushort *)(puVar6 + 4) = uVar1;
    *(ushort *)((long)puVar6 + 0x22) = uVar2;
    puVar6[3] = 0;
    *(undefined8 **)(in_RCX + 0x18) = puVar6;
    for (uVar7 = 0; uVar7 < uVar2; uVar7 = uVar7 + 1) {
      uVar3 = cio_read((opj_cio_t *)
                       CONCAT26(uVar1,CONCAT24(uVar2,CONCAT22(uVar7,in_stack_ffffffffffffffb0))),
                       in_stack_ffffffffffffffac);
      in_stack_ffffffffffffffac = CONCAT13((byte)uVar3,(int3)in_stack_ffffffffffffffac);
      *(byte *)((long)pvVar4 + (ulong)uVar7) = ((byte)uVar3 & 0x7f) + 1;
      *(bool *)((long)pvVar5 + (ulong)uVar7) = (uVar3 & 0x80) != 0;
    }
    for (uVar7 = 0; uVar7 < uVar1; uVar7 = uVar7 + 1) {
      for (uVar8 = 0; uVar8 < uVar2; uVar8 = uVar8 + 1) {
        uVar3 = cio_read((opj_cio_t *)CONCAT26(uVar1,CONCAT24(uVar2,CONCAT22(uVar8,uVar7))),
                         in_stack_ffffffffffffffac);
        *local_48 = uVar3;
        local_48 = local_48 + 1;
      }
    }
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static opj_bool jp2_read_pclr(opj_jp2_t *jp2, opj_cio_t *cio,
	opj_jp2_box_t *box, opj_jp2_color_t *color)
{
	opj_jp2_pclr_t *jp2_pclr;
	unsigned char *channel_size, *channel_sign;
	unsigned int *entries;
	unsigned short nr_entries, nr_channels;
	unsigned short i, j;
	unsigned char uc;

	OPJ_ARG_NOT_USED(box);
	OPJ_ARG_NOT_USED(jp2);

/* Part 1, I.5.3.4: 'There shall be at most one Palette box inside
 * a JP2 Header box' :
*/
	if(color->jp2_pclr) return OPJ_FALSE;

	nr_entries = (unsigned short)cio_read(cio, 2); /* NE */
	nr_channels = (unsigned short)cio_read(cio, 1);/* NPC */

	entries = (unsigned int*)
	 opj_malloc(nr_channels * nr_entries * sizeof(unsigned int));
	channel_size = (unsigned char*)opj_malloc(nr_channels);
	channel_sign = (unsigned char*)opj_malloc(nr_channels);

	jp2_pclr = (opj_jp2_pclr_t*)opj_malloc(sizeof(opj_jp2_pclr_t));
	jp2_pclr->channel_sign = channel_sign;
	jp2_pclr->channel_size = channel_size;
	jp2_pclr->entries = entries;
	jp2_pclr->nr_entries = nr_entries;
	jp2_pclr->nr_channels = nr_channels;
	jp2_pclr->cmap = NULL;

	color->jp2_pclr = jp2_pclr;

	for(i = 0; i < nr_channels; ++i)
   {
	uc = cio_read(cio, 1); /* Bi */
	channel_size[i] = (uc & 0x7f) + 1;
	channel_sign[i] = (uc & 0x80)?1:0;
   }

	for(j = 0; j < nr_entries; ++j)
   {
	for(i = 0; i < nr_channels; ++i)
  {
/* Cji */
	*entries++ = cio_read(cio, channel_size[i]>>3);
  }
   }

	return OPJ_TRUE;
}